

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gauden.c
# Opt level: O0

void log_topn_densities(float64 *den,uint32 *den_idx,uint32 n_top,uint32 n_density,uint32 veclen,
                       vector_t obs,vector_t *mean,vector_t *var,float32 *log_norm,
                       uint32 *prev_den_idx)

{
  uint uVar1;
  bool bVar2;
  float64 fVar3;
  double local_68;
  float64 worst;
  float64 d;
  float64 diff;
  vector_t v;
  vector_t m;
  uint local_38;
  uint32 k;
  uint32 j;
  uint32 i;
  vector_t obs_local;
  uint32 veclen_local;
  uint32 n_density_local;
  uint32 n_top_local;
  uint32 *den_idx_local;
  float64 *den_local;
  
  if (prev_den_idx == (uint32 *)0x0) {
    for (local_38 = 0; local_38 < n_top; local_38 = local_38 + 1) {
      den[local_38] = -1.8e+307;
      den_idx[local_38] = n_density + 1;
    }
  }
  else {
    for (local_38 = 0; local_38 < n_top; local_38 = local_38 + 1) {
      uVar1 = prev_den_idx[local_38];
      fVar3 = log_diag_eval(obs,log_norm[uVar1],mean[uVar1],var[uVar1],veclen);
      den_idx[local_38] = uVar1;
      den[local_38] = fVar3;
      if (local_38 != 0) {
        m._4_4_ = local_38;
        while( true ) {
          bVar2 = false;
          if (m._4_4_ != 0) {
            bVar2 = (double)den[m._4_4_ - 1] <= (double)fVar3 &&
                    (double)fVar3 != (double)den[m._4_4_ - 1];
          }
          if (!bVar2) break;
          den_idx[m._4_4_] = den_idx[m._4_4_ - 1];
          den[m._4_4_] = den[m._4_4_ - 1];
          m._4_4_ = m._4_4_ - 1;
        }
        den_idx[m._4_4_] = uVar1;
        den[m._4_4_] = fVar3;
      }
    }
  }
  local_68 = (double)den[n_top - 1];
  for (k = 0; k < n_density; k = k + 1) {
    worst = (float64)(double)(float)log_norm[k];
    for (local_38 = 0; local_38 < veclen && local_68 < (double)worst; local_38 = local_38 + 1) {
      worst = (float64)(-((double)(obs[local_38] - mean[k][local_38]) *
                         (double)(obs[local_38] - mean[k][local_38])) * (double)var[k][local_38] +
                       (double)worst);
    }
    if ((veclen <= local_38) && (local_68 < (double)worst)) {
      for (local_38 = 0; (local_38 < n_top && (den_idx[local_38] != k)); local_38 = local_38 + 1) {
      }
      if (n_top <= local_38) {
        m._4_4_ = n_top - 1;
        while( true ) {
          bVar2 = false;
          if (m._4_4_ != 0) {
            bVar2 = (double)den[m._4_4_ - 1] <= (double)worst &&
                    (double)worst != (double)den[m._4_4_ - 1];
          }
          if (!bVar2) break;
          den_idx[m._4_4_] = den_idx[m._4_4_ - 1];
          den[m._4_4_] = den[m._4_4_ - 1];
          m._4_4_ = m._4_4_ - 1;
        }
        den_idx[m._4_4_] = k;
        den[m._4_4_] = worst;
        local_68 = (double)den[n_top - 1];
      }
    }
  }
  return;
}

Assistant:

static void
log_topn_densities(float64 *den,
		   uint32 *den_idx,
		   uint32 n_top,
		   uint32 n_density,
		   uint32 veclen,
		   vector_t obs,
		   vector_t *mean,
		   vector_t *var,
		   float32 *log_norm,
		   uint32 *prev_den_idx)
{
    uint32 i, j, k;
    vector_t m;
    vector_t v;
    float64 diff;
    float64 d;
    float64 worst;	/* worst density value of the top N density values
			   seen so far */

    /* Initialize topn using the previous frame's top codeword indices */
    if (prev_den_idx) {
	for (j = 0; j < n_top; j++) {
	    i = prev_den_idx[j];
	    d = log_diag_eval(obs, log_norm[i],
			      mean[i], var[i], veclen);
	    den_idx[j] = i;
	    den[j] = d;
	    if (j == 0)
		continue;
	    /* Insertion sort them */
	    for (k = j; k > 0 && d > den[k-1]; --k) {
		den_idx[k] = den_idx[k-1];
		den[k] = den[k-1];
	    }
	    den_idx[k] = i;
	    den[k] = d;
	}
    }
    else {
	for (j = 0; j < n_top; j++) {
	    den[j] = MIN_IEEE_NORM_NEG_FLOAT64;
	    den_idx[j] = n_density + 1; /* A non-negative invalid value */
	}
    }

    worst = den[n_top-1];

    for (i = 0; i < n_density; i++) {
	m = mean[i];
	v = var[i];

	/* Initialize distance with the log of the normalization
	   factor for this pdf. */

	d = log_norm[i];

	for (j = 0; (j < veclen) && (d > worst); j++) {
	    diff = obs[j] - m[j];
	    d -= diff * diff * v[j];
	}
	/* Not in topn, so keep going */
	if (j < veclen || d <= worst)
	    continue;

	/* This may already have been in topn from the initialization pass */
	for (j = 0; j < n_top; j++)
	    if (den_idx[j] == i)
		break;
	if (j < n_top)
	    continue; /* It's already there, don't insert it */
	for (k = n_top-1; k > 0 && d > den[k-1]; --k) {
	    den_idx[k] = den_idx[k-1];
	    den[k] = den[k-1];
	}
	den_idx[k] = i;
	den[k] = d;

	worst = den[n_top-1];
    }
    worst = den[n_top-1];
}